

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  char *digits;
  appender aVar5;
  byte *pbVar6;
  char *pcVar7;
  long lVar8;
  write_int_arg<unsigned_int> wVar9;
  char *pcVar10;
  buffer<char> *buf;
  ulong uVar11;
  int size;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  format_decimal_result<char_*> fVar16;
  char buffer [10];
  write_int_data<char> data;
  byte local_69;
  bool local_68;
  char cStack_67;
  undefined2 uStack_66;
  undefined4 uStack_64;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined5 uStack_5d;
  size_t sStack_58;
  anon_class_8_2_0dfc6556_for_write_digits aStack_50;
  bool local_48;
  write_int_data<char> local_40;
  
  pVar1 = specs->type;
  if (pVar1 < string) {
    uVar15 = (ulong)arg >> 0x20;
    uVar14 = arg.prefix;
    uVar12 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      uVar13 = 0x1f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar11 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8) +
               ((ulong)arg & 0xffffffff);
      size = (int)(uVar11 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,size,uVar14,specs);
        local_68 = arg.prefix._0_1_;
        cStack_67 = arg.prefix._1_1_;
        uStack_66 = arg.prefix._2_2_;
        uStack_60 = (undefined1)local_40.size;
        uStack_5f = (undefined1)(local_40.size >> 8);
        uStack_5e = (undefined1)(local_40.size >> 0x10);
        uStack_5d = (undefined5)(local_40.size >> 0x18);
        sStack_58 = local_40.padding;
        aStack_50 = (anon_class_8_2_0dfc6556_for_write_digits)
                    (uVar11 & 0xffffffff00000000 | (ulong)arg & 0xffffffff);
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)&local_68);
        return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      }
      if ((long)uVar11 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                    ,0x189,"negative value");
      }
      if ((uVar15 != 0) && (uVar14 = uVar14 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar15 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x18) < uVar15) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 0x10);
            uVar15 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x10) = uVar15;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar14;
          bVar2 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar2);
      }
      uStack_60 = 0;
      uStack_5f = 0;
      local_68 = false;
      cStack_67 = '\0';
      uStack_66 = 0;
      uStack_64 = 0;
      fVar16 = format_decimal<char,unsigned_int>(&local_68,uVar12,size);
      pcVar7 = fVar16.end;
      break;
    case oct:
      uVar13 = 0x1f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = uVar13 & 0xff;
      bVar3 = (char)(uVar13 * 0x56 >> 8) + 1;
      uVar11 = (ulong)bVar3;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar12 != 0 && specs->precision <= (int)(uint)bVar3))
      {
        uVar12 = 0x3000;
        if (uVar15 == 0) {
          uVar12 = 0x30;
        }
        uVar15 = (ulong)((uVar12 | uVar14) + 0x1000000);
      }
      uVar12 = (uint)uVar15;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,(uint)bVar3,uVar12,specs);
        local_68 = SUB81(uVar15,0);
        cStack_67 = (char)(uVar15 >> 8);
        uStack_66 = (undefined2)(uVar15 >> 0x10);
        uStack_60 = (undefined1)local_40.size;
        uStack_5f = (undefined1)(local_40.size >> 8);
        uStack_5e = (undefined1)(local_40.size >> 0x10);
        uStack_5d = (undefined5)(local_40.size >> 0x18);
        sStack_58 = local_40.padding;
        aStack_50 = (anon_class_8_2_0dfc6556_for_write_digits)
                    ((ulong)arg & 0xffffffff | uVar11 << 0x20);
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)&local_68);
        return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      }
      if ((uVar12 != 0) && (uVar12 = uVar12 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar15 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x18) < uVar15) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 0x10);
            uVar15 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x10) = uVar15;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar12;
          bVar2 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar2);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar15 = lVar8 + uVar11;
      if (uVar15 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                     .container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar15;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) != 0) {
          pbVar6 = (byte *)(*(long *)((long)out.
                                            super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                            .container + 8) + lVar8 + (ulong)uVar13 / 3);
          wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            uVar12 = arg.abs_value;
            *pbVar6 = (byte)arg.abs_value & 7 | 0x30;
            wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
            pbVar6 = pbVar6 + -1;
            arg = wVar9;
          } while (7 < uVar12);
          return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        }
      }
      uStack_60 = 0;
      uStack_5f = 0;
      uStack_5e = 0;
      local_68 = false;
      cStack_67 = '\0';
      uStack_66 = 0;
      uStack_64 = 0;
      pcVar7 = &local_68 + uVar11;
      pbVar6 = &local_68 + (ulong)uVar13 / 3;
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pbVar6 = (byte)arg.abs_value & 7 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
        pbVar6 = pbVar6 + -1;
        arg = wVar9;
      } while (7 < uVar12);
      break;
    case hex_lower:
    case hex_upper:
      local_69 = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar13 = uVar4 << 8;
        if (uVar15 == 0) {
          uVar13 = uVar4;
        }
        uVar15 = (ulong)((uVar13 | uVar14) + 0x2000000);
      }
      uVar14 = 0x1f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar12 = 8 - ((uVar14 ^ 0x1c) >> 2);
      uVar11 = (ulong)uVar12;
      uVar14 = (uint)uVar15;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,uVar12,uVar14,specs);
        local_68 = SUB81(uVar15,0);
        cStack_67 = (char)(uVar15 >> 8);
        uStack_66 = (undefined2)(uVar15 >> 0x10);
        uStack_60 = (undefined1)local_40.size;
        uStack_5f = (undefined1)(local_40.size >> 8);
        uStack_5e = (undefined1)(local_40.size >> 0x10);
        uStack_5d = (undefined5)(local_40.size >> 0x18);
        sStack_58 = local_40.padding;
        aStack_50 = (anon_class_8_2_0dfc6556_for_write_digits)
                    ((ulong)arg & 0xffffffff | uVar11 << 0x20);
        local_48 = (bool)local_69;
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_40_3_03e05ccd *)&local_68);
        return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      }
      if ((uVar14 != 0) && (uVar12 = uVar14 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar15 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x18) < uVar15) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 0x10);
            uVar15 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x10) = uVar15;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar12;
          bVar2 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar2);
      }
      uVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x10) + uVar11;
      if (uVar15 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                     .container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar15;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) != 0) {
          pcVar7 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar7 = "0123456789ABCDEF";
          }
          pcVar10 = (char *)(uVar15 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                                  .container + 8));
          wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar10 = pcVar10 + -1;
            uVar12 = arg.abs_value;
            *pcVar10 = pcVar7[uVar12 & 0xf];
            wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
            arg = wVar9;
          } while (0xf < uVar12);
          return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        }
      }
      uStack_60 = 0;
      local_68 = false;
      cStack_67 = '\0';
      uStack_66 = 0;
      uStack_64 = 0;
      pcVar7 = &local_68 + uVar11;
      pcVar10 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar10 = "0123456789ABCDEF";
      }
      pbVar6 = &local_69 + uVar11;
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pbVar6 = pcVar10[uVar12 & 0xf];
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
        pbVar6 = pbVar6 + -1;
        arg = wVar9;
      } while (0xf < uVar12);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar13 = uVar4 << 8;
        if (uVar15 == 0) {
          uVar13 = uVar4;
        }
        uVar15 = (ulong)((uVar13 | uVar14) + 0x2000000);
      }
      uVar14 = 0x1f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar12 = (uVar14 ^ 0xffffffe0) + 0x21;
      uVar11 = (ulong)uVar12;
      uVar14 = (uint)uVar15;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,uVar12,uVar14,specs);
        local_68 = SUB81(uVar15,0);
        cStack_67 = (char)(uVar15 >> 8);
        uStack_66 = (undefined2)(uVar15 >> 0x10);
        uStack_60 = (undefined1)local_40.size;
        uStack_5f = (undefined1)(local_40.size >> 8);
        uStack_5e = (undefined1)(local_40.size >> 0x10);
        uStack_5d = (undefined5)(local_40.size >> 0x18);
        sStack_58 = local_40.padding;
        aStack_50 = (anon_class_8_2_0dfc6556_for_write_digits)
                    ((ulong)arg & 0xffffffff | uVar11 << 0x20);
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)&local_68);
        return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      }
      if ((uVar14 != 0) && (uVar12 = uVar14 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar15 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x18) < uVar15) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 0x10);
            uVar15 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x10) = uVar15;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar12;
          bVar2 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar2);
      }
      uVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x10) + uVar11;
      if (uVar15 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                     .container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar15;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) != 0) {
          pbVar6 = (byte *)(uVar15 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                                  .container + 8));
          wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pbVar6 = pbVar6 + -1;
            uVar12 = arg.abs_value;
            *pbVar6 = (byte)arg.abs_value & 1 | 0x30;
            wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
            arg = wVar9;
          } while (1 < uVar12);
          return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        }
      }
      sStack_58 = 0;
      aStack_50.abs_value = 0;
      aStack_50.num_digits = 0;
      local_68 = false;
      cStack_67 = '\0';
      uStack_66 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5f = 0;
      uStack_5e = 0;
      uStack_5d = 0;
      local_48 = false;
      pcVar7 = &local_68 + uVar11;
      pbVar6 = &local_69 + uVar11;
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pbVar6 = (byte)arg.abs_value & 1 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
        pbVar6 = pbVar6 + -1;
        arg = wVar9;
      } while (1 < uVar12);
      break;
    default:
      goto switchD_00188730_caseD_7;
    case chr:
      local_68 = false;
      cStack_67 = (char)arg.abs_value;
      aVar5 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_68);
      return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    }
    aVar5 = copy_str_noinline<char,char*,fmt::v10::appender>(&local_68,pcVar7,out);
    return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
switchD_00188730_caseD_7:
  throw_format_error("invalid format specifier");
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs<Char>& specs,
                                        locale_ref) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");
  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    auto num_digits = count_digits(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    int num_digits = count_digits<4>(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_uint<4, Char>(it, abs_value, num_digits, upper);
        });
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    int num_digits = count_digits<1>(abs_value);
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<1, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::oct: {
    int num_digits = count_digits<3>(abs_value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<3, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(abs_value), specs);
  default:
    throw_format_error("invalid format specifier");
  }
  return out;
}